

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeLDRPreReg(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t Val;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  MCInst *in_RCX;
  void *in_RDX;
  uint32_t in_ESI;
  undefined8 in_RDI;
  uint imm;
  uint Rt;
  uint Rn;
  uint Rm;
  uint pred;
  DecodeStatus S;
  uint64_t in_stack_ffffffffffffffb8;
  DecodeStatus RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  uint Val_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  Val_00 = (uint)((ulong)in_RDI >> 0x20);
  RegNo = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  Val = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,0xc);
  uVar4 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar5 = uVar4 << 0xd | uVar3;
  uVar3 = fieldFromInstruction_4(in_ESI,0x17,1);
  uVar5 = uVar3 << 0xc | uVar5;
  fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,4);
  if ((uVar2 == 0xf) || (uVar2 == Val)) {
    RegNo = MCDisassembler_SoftFail;
  }
  if (uVar3 == 0xf) {
    RegNo = MCDisassembler_SoftFail;
  }
  DVar6 = DecodeGPRRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar2),(void *)CONCAT44(Val,uVar5));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
  if (_Var1) {
    DVar6 = DecodeGPRRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar2),(void *)CONCAT44(Val,uVar5));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (_Var1) {
      DVar6 = DecodeSORegMemOperand
                        ((MCInst *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         Val_00,CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (_Var1) {
        DVar6 = DecodePredicateOperand
                          ((MCInst *)CONCAT44(uVar3,uVar2),Val,in_stack_ffffffffffffffb8,
                           (void *)0x28db51);
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
        if (!_Var1) {
          RegNo = MCDisassembler_Fail;
        }
      }
      else {
        RegNo = MCDisassembler_Fail;
      }
    }
    else {
      RegNo = MCDisassembler_Fail;
    }
  }
  else {
    RegNo = MCDisassembler_Fail;
  }
  return RegNo;
}

Assistant:

static DecodeStatus DecodeLDRPreReg(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred, Rm;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;
	if (Rm == 0xF) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSORegMemOperand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}